

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pointer_based_iterator.cpp
# Opt level: O0

void __thiscall
PointerBasedIterator_PreDecrement_Test::TestBody(PointerBasedIterator_PreDecrement_Test *this)

{
  bool bVar1;
  reference pvVar2;
  pointer_based_iterator<int> *ppVar3;
  char *pcVar4;
  value_type_conflict2 *pvVar5;
  AssertHelper local_d8;
  Message local_d0;
  int local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_3;
  Message local_a8;
  pointer_based_iterator<int> local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  Message local_80;
  int local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_58 [3];
  pointer_based_iterator<int> local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  iterator i;
  array<int,_3UL> arr;
  PointerBasedIterator_PreDecrement_Test *this_local;
  
  i.pos_ = (pointer)0x300000001;
  pvVar2 = std::array<int,_3UL>::operator[]((array<int,_3UL> *)&i,0);
  pstore::pointer_based_iterator<int>::pointer_based_iterator<int,void>
            ((pointer_based_iterator<int> *)&gtest_ar.message_,pvVar2 + 3);
  ppVar3 = pstore::pointer_based_iterator<int>::operator--
                     ((pointer_based_iterator<int> *)&gtest_ar.message_);
  pvVar2 = std::array<int,_3UL>::operator[]((array<int,_3UL> *)&i,2);
  pstore::pointer_based_iterator<int>::pointer_based_iterator<int,void>(&local_40,pvVar2);
  testing::internal::EqHelper::
  Compare<pstore::pointer_based_iterator<int>,_pstore::pointer_based_iterator<int>,_nullptr>
            ((EqHelper *)local_38,"--i","iterator{&arr[2]}",ppVar3,&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_pointer_based_iterator.cpp"
               ,0x44,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  pvVar5 = pstore::pointer_based_iterator<int>::operator*
                     ((pointer_based_iterator<int> *)&gtest_ar.message_);
  local_74 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_70,"*i","5",pvVar5,&local_74);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_pointer_based_iterator.cpp"
               ,0x45,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  ppVar3 = pstore::pointer_based_iterator<int>::operator--
                     ((pointer_based_iterator<int> *)&gtest_ar.message_);
  pvVar2 = std::array<int,_3UL>::operator[]((array<int,_3UL> *)&i,1);
  pstore::pointer_based_iterator<int>::pointer_based_iterator<int,void>(&local_a0,pvVar2);
  testing::internal::EqHelper::
  Compare<pstore::pointer_based_iterator<int>,_pstore::pointer_based_iterator<int>,_nullptr>
            ((EqHelper *)local_98,"--i","iterator{&arr[1]}",ppVar3,&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_pointer_based_iterator.cpp"
               ,0x46,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  pvVar5 = pstore::pointer_based_iterator<int>::operator*
                     ((pointer_based_iterator<int> *)&gtest_ar.message_);
  local_c4 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_c0,"*i","3",pvVar5,&local_c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_pointer_based_iterator.cpp"
               ,0x47,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  return;
}

Assistant:

TEST_F (PointerBasedIterator, PreDecrement) {
    std::array<int, 3> arr{{1, 3, 5}};
    iterator i{&arr[0] + 3};
    EXPECT_EQ (--i, iterator{&arr[2]});
    EXPECT_EQ (*i, 5);
    EXPECT_EQ (--i, iterator{&arr[1]});
    EXPECT_EQ (*i, 3);
}